

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O1

void __thiscall flatbuffers::CodeWriter::AppendIdent(CodeWriter *this,stringstream *stream)

{
  int iVar1;
  
  iVar1 = *(int *)(this + 0x1d8);
  if (iVar1 != 0) {
    do {
      std::ostream::write((char *)(stream + 0x10),*(long *)(this + 0x1b8));
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void CodeWriter::AppendIdent(std::stringstream &stream) {
  int lvl = cur_ident_lvl_;
  while (lvl--) {
    stream.write(pad_.c_str(), static_cast<std::streamsize>(pad_.size()));
  }
}